

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<unsigned_int>::append(Array<unsigned_int> *this,Array<unsigned_int> *values)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  uint *puVar4;
  
  lVar3 = (long)(values->_end).item - (long)(values->_begin).item;
  reserve(this,(lVar3 >> 2) + ((long)(this->_end).item - (long)(this->_begin).item >> 2));
  puVar1 = (this->_end).item;
  if (0 < lVar3) {
    puVar4 = (uint *)(lVar3 + (long)puVar1);
    puVar2 = (values->_begin).item;
    do {
      *puVar1 = *puVar2;
      puVar1 = puVar1 + 1;
      puVar2 = puVar2 + 1;
    } while (puVar1 < puVar4);
  }
  (this->_end).item = puVar1;
  return;
}

Assistant:

void append(const Array& values)
  {
    usize size = _end.item - _begin.item;
    usize valuesSize = values.size();
    reserve(size + valuesSize);
    T* item = _end.item;
    for(T* end = item + valuesSize, *src = values._begin.item; item < end; ++item, ++src)
    {
#ifdef VERIFY
      VERIFY(new(item) T(*src) == item);
#else
      new(item) T(*src);
#endif
    }
    _end.item = item;
  }